

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExperimentResult.cpp
# Opt level: O2

double __thiscall celero::ExperimentResult::getBaselineMeasurement(ExperimentResult *this)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  shared_ptr<celero::Experiment> baselineExperiment;
  shared_ptr<celero::ExperimentResult> baselineResult;
  shared_ptr<celero::Benchmark> bm;
  double local_50;
  Benchmark local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_> local_38
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_> local_28
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  bVar1 = Experiment::getIsBaselineCase
                    (*(Experiment **)
                      ((long)(this->pimpl)._pimpl._M_t.
                             super___uniq_ptr_impl<celero::ExperimentResult::Impl,_std::default_delete<celero::ExperimentResult::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_celero::ExperimentResult::Impl_*,_std::default_delete<celero::ExperimentResult::Impl>_>
                             .super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false> + 0x98)
                    );
  if (bVar1) {
    return 1.0;
  }
  Experiment::getBenchmark((Experiment *)&local_28);
  if (local_28._M_t.
      super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
      .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>)
      0x0) {
    Benchmark::getBaseline(&local_48);
    if (local_48.pimpl._pimpl._M_t.
        super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
        .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false>._M_head_impl ==
        (unique_ptr<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>)0x0) {
      bVar1 = true;
    }
    else {
      Experiment::getResultByValue
                ((Experiment *)&local_38,
                 (int64_t)local_48.pimpl._pimpl._M_t.
                          super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
                          .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false>._M_head_impl);
      bVar1 = true;
      if (((_Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
            )local_38._M_t.
             super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
             .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl != (Impl *)0x0)
         && (dVar2 = getUsPerCall((ExperimentResult *)
                                  local_38._M_t.
                                  super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
                                  .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>.
                                  _M_head_impl), 0.0 < dVar2)) {
        dVar3 = getUsPerCall(this);
        local_50 = dVar3 / dVar2;
        bVar1 = false;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    if (!bVar1) goto LAB_0013cd88;
  }
  local_50 = -1.0;
LAB_0013cd88:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return local_50;
}

Assistant:

double ExperimentResult::getBaselineMeasurement() const
{
	if(this->pimpl->parent->getIsBaselineCase() == false)
	{
		const auto bm = this->pimpl->parent->getBenchmark();

		if(bm != nullptr)
		{
			const auto baselineExperiment = bm->getBaseline();

			if(baselineExperiment != nullptr)
			{
				const auto baselineResult = baselineExperiment->getResultByValue(this->getProblemSpaceValue());

				if(baselineResult != nullptr)
				{
					const auto baselineResultUs = baselineResult->getUsPerCall();

					// Prevent possible divide by zero.
					if(baselineResultUs > 0)
					{
						return this->getUsPerCall() / baselineResult->getUsPerCall();
					}
				}
			}
		}

		return -1.0;
	}

	return 1.0;
}